

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall
lest::to_string<unsigned_long,unsigned_long>
          (string *__return_storage_ptr__,lest *this,unsigned_long *lhs,string *op,
          unsigned_long *rhs)

{
  ostream *poVar1;
  unsigned_long *value;
  unsigned_long *value_00;
  ostringstream os;
  string sStack_1d8;
  string local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  string_maker<unsigned_long>::to_string_abi_cxx11_
            (&local_1b8,(string_maker<unsigned_long> *)this,value);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  string_maker<unsigned_long>::to_string_abi_cxx11_
            (&sStack_1d8,(string_maker<unsigned_long> *)op,value_00);
  std::operator<<(poVar1,(string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}